

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncDrawIndirect::Run(AdvancedSyncDrawIndirect *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int h;
  vec4 *expected;
  undefined8 local_28;
  undefined8 uStack_20;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  lVar5 = 0x10;
  if (bVar1) {
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nwriteonly uniform uimageBuffer g_draw_command_buffer;\nvoid main() {\n  imageStore(g_draw_command_buffer, 0, uvec4(4, 1, 0, 0));\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    this->m_store_program = GVar2;
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,
                       "#version 420 core\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
                       ,(bool *)0x0);
    this->m_draw_program = GVar2;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_draw_command_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_command_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_draw_command_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_draw_command_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d70,this->m_draw_command_buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_attribless_vao);
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_draw_vao,&this->m_draw_vbo,
               (GLuint *)0x0);
    h = 0;
    expected = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture
              (this_00,0,this->m_draw_command_buffer_tex,0,'\0',0,0x88ba,0x8d70);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vao);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
    glu::CallLogWrapper::glDisable(this_00,0x8c89);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vao);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_command_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x40);
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,5,(void *)0x0);
    iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
    iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_28 = 0x3f80000000000000;
    uStack_20 = 0x3f80000000000000;
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,iVar3,
                       *(int *)(CONCAT44(extraout_var_00,iVar4) + 4),(int)&local_28,h,expected);
    lVar5 = (ulong)bVar1 - 1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		const char* const glsl_store_vs =
			"#version 420 core" NL "writeonly uniform uimageBuffer g_draw_command_buffer;" NL "void main() {" NL
			"  imageStore(g_draw_command_buffer, 0, uvec4(4, 1, 0, 0));" NL "}";
		const char* const glsl_draw_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
										 "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_draw_fs = "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
										 "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_store_program = BuildProgram(glsl_store_vs, NULL, NULL, NULL, NULL);
		m_draw_program  = BuildProgram(glsl_draw_vs, NULL, NULL, NULL, glsl_draw_fs);

		glGenBuffers(1, &m_draw_command_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_command_buffer);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(uvec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, 0);

		glGenTextures(1, &m_draw_command_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_draw_command_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32UI, m_draw_command_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenVertexArrays(1, &m_attribless_vao);
		CreateFullViewportQuad(&m_draw_vao, &m_draw_vbo, NULL);

		glBindImageTexture(0, m_draw_command_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_store_program);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 1);

		glDisable(GL_RASTERIZER_DISCARD);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_command_buffer);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT);
		glDrawArraysIndirect(GL_TRIANGLE_STRIP, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}